

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O3

void Gia_ManSatokoDimacs(char *pFileName,satoko_opts_t *opts)

{
  int iVar1;
  int iVar2;
  satoko_t *s;
  long lVar3;
  long lVar4;
  satoko_opts_t *opts_00;
  timespec ts;
  long local_28;
  long local_20;
  
  opts_00 = (satoko_opts_t *)&stack0xffffffffffffffd8;
  iVar1 = clock_gettime(3,(timespec *)&stack0xffffffffffffffd8);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28 * -1000000;
  }
  s = Gia_ManSatokoFromDimacs(pFileName,opts_00);
  if (s == (satoko_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = satoko_solve(s);
    satoko_destroy(s);
  }
  iVar2 = clock_gettime(3,(timespec *)&stack0xffffffffffffffd8);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_20 / 1000 + local_28 * 1000000;
  }
  Gia_ManSatokoReport(-1,iVar1,lVar4 + lVar3);
  return;
}

Assistant:

void Gia_ManSatokoDimacs( char * pFileName, satoko_opts_t * opts )
{
    abctime clk = Abc_Clock();  
    int status = SATOKO_UNSAT;
    satoko_t * pSat = Gia_ManSatokoFromDimacs( pFileName, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( -1, status, Abc_Clock() - clk );
}